

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdAddImm(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  uint uVar1;
  uint uVar2;
  uint num;
  
  uVar1 = cmd._1_4_ & 0xff;
  uVar2 = cmd._2_4_ & 0xff;
  num = cmd.argument;
  if (uVar1 == uVar2) {
    reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar1 << 3,true);
    if (reg1 == rRegCount) {
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_add,sDWORD,rEBX,uVar1 << 3,num);
      return;
    }
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    EMIT_OP_REG_NUM(&ctx->ctx,o_add,reg1,num);
  }
  else {
    reg1 = rEAX;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,uVar2 << 3);
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    EMIT_OP_REG_NUM(&ctx->ctx,o_add,rEAX,num);
  }
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,uVar1 << 3,reg1);
  return;
}

Assistant:

void GenCodeCmdAddImm(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	if(cmd.rA == cmd.rB)
	{
		x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rA * 8, true);

		if(sourceReg == rRegCount)
		{
			EMIT_OP_RPTR_NUM(ctx.ctx, o_add, sDWORD, rREG, cmd.rA * 8, cmd.argument); // Modify inplace
		}
		else
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_REG_NUM(ctx.ctx, o_add, sourceReg, cmd.argument); // Modify inplace
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, sourceReg); // Store int to target
		}
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8); // Load value

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEAX, cmd.argument);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store to target
	}
}